

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_case_registry_impl.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getFilteredTests
          (TestRegistry *this,TestSpec *testSpec,IConfig *config,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases,bool negated)

{
  bool bVar1;
  uint uVar2;
  reference pTVar3;
  pointer this_00;
  byte local_61;
  byte local_51;
  const_iterator cStack_40;
  bool includeTest;
  const_iterator itEnd;
  const_iterator it;
  bool negated_local;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestCases_local;
  IConfig *config_local;
  TestSpec *testSpec_local;
  TestRegistry *this_local;
  
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                    (&this->m_functionsInOrder);
  cStack_40 = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                        (&this->m_functionsInOrder);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&stack0xffffffffffffffc0), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar1 = TestSpec::matches(testSpec,&pTVar3->super_TestCaseInfo);
    local_51 = 0;
    if (bVar1) {
      uVar2 = (*(config->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
      local_61 = 1;
      if ((uVar2 & 1) == 0) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                  ::operator->(&itEnd);
        bVar1 = TestCaseInfo::throws(&this_00->super_TestCaseInfo);
        local_61 = bVar1 ^ 0xff;
      }
      local_51 = local_61;
    }
    if ((bool)(local_51 & 1) != negated) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (matchingTestCases,pTVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  sortTests(config,matchingTestCases);
  return;
}

Assistant:

virtual void getFilteredTests( TestSpec const& testSpec, IConfig const& config, std::vector<TestCase>& matchingTestCases, bool negated = false ) const {

            for( std::vector<TestCase>::const_iterator  it = m_functionsInOrder.begin(),
                                                        itEnd = m_functionsInOrder.end();
                    it != itEnd;
                    ++it ) {
                bool includeTest = testSpec.matches( *it ) && ( config.allowThrows() || !it->throws() );
                if( includeTest != negated )
                    matchingTestCases.push_back( *it );
            }
            sortTests( config, matchingTestCases );
        }